

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O1

void __thiscall CLI::RequiresError::~RequiresError(RequiresError *this)

{
  pointer pcVar1;
  
  *(undefined ***)&(this->super_ParseError).super_Error = &PTR__Error_0011c9e8;
  pcVar1 = (this->super_ParseError).super_Error.name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_ParseError).super_Error.name.field_2) {
    operator_delete(pcVar1);
  }
  ::std::runtime_error::~runtime_error((runtime_error *)this);
  operator_delete(this);
  return;
}

Assistant:

RequiresError(std::string curname, std::string subname)
        : RequiresError(curname + " requires " + subname, ExitCodes::RequiresError) {}